

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  size_t code;
  size_t errorCode;
  U64 restToBeat;
  short proba;
  U32 lowThreshold;
  uint uStack_58;
  short largestP;
  uint largest;
  uint s;
  int stillToDistribute;
  U64 vStep;
  U64 step;
  U64 scale;
  uint maxSymbolValue_local;
  size_t total_local;
  uint *count_local;
  uint tableLog_local;
  short *normalizedCounter_local;
  
  count_local._4_4_ = tableLog;
  if (tableLog == 0) {
    count_local._4_4_ = 0xb;
  }
  if (count_local._4_4_ < 5) {
    normalizedCounter_local = (short *)0xffffffffffffffff;
  }
  else if (count_local._4_4_ < 0xd) {
    uVar4 = FSE_minTableLog(total,maxSymbolValue);
    if (count_local._4_4_ < uVar4) {
      normalizedCounter_local = (short *)0xffffffffffffffff;
    }
    else {
      bVar3 = (byte)count_local._4_4_;
      bVar2 = -bVar3 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total;
      lVar5 = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
      largest = 1 << (bVar3 & 0x1f);
      lowThreshold = 0;
      proba = 0;
      for (uStack_58 = 0; uStack_58 <= maxSymbolValue; uStack_58 = uStack_58 + 1) {
        if (count[uStack_58] == total) {
          return 0;
        }
        if (count[uStack_58] == 0) {
          normalizedCounter[uStack_58] = 0;
        }
        else if ((uint)(total >> (bVar3 & 0x3f)) < count[uStack_58]) {
          restToBeat._2_2_ = (short)((ulong)count[uStack_58] * lVar5 >> (bVar2 & 0x3f));
          if (restToBeat._2_2_ < 8) {
            restToBeat._2_2_ =
                 restToBeat._2_2_ +
                 (ushort)((1L << (-bVar3 + 0x2a & 0x3f)) *
                          (ulong)FSE_normalizeCount::rtbTable[restToBeat._2_2_] <
                         (ulong)count[uStack_58] * lVar5 -
                         ((long)restToBeat._2_2_ << (bVar2 & 0x3f)));
          }
          if (proba < restToBeat._2_2_) {
            proba = restToBeat._2_2_;
            lowThreshold = uStack_58;
          }
          normalizedCounter[uStack_58] = restToBeat._2_2_;
          largest = largest - (int)restToBeat._2_2_;
        }
        else {
          normalizedCounter[uStack_58] = -1;
          largest = largest - 1;
        }
      }
      if ((int)-largest < (int)normalizedCounter[lowThreshold] >> 1) {
        normalizedCounter[lowThreshold] = normalizedCounter[lowThreshold] + (short)largest;
      }
      else {
        code = FSE_normalizeM2(normalizedCounter,count_local._4_4_,count,total,maxSymbolValue);
        uVar4 = ERR_isError(code);
        if (uVar4 != 0) {
          return code;
        }
      }
      normalizedCounter_local = (short *)(ulong)count_local._4_4_;
    }
  }
  else {
    normalizedCounter_local = (short *)0xffffffffffffffd4;
  }
  return (size_t)normalizedCounter_local;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}